

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

void __thiscall Problem_CGBG_FF::ScatterHouses(Problem_CGBG_FF *this)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  
  for (uVar1 = 0; uVar2 = (ulong)uVar1, uVar2 < this->_m_nrHouses; uVar1 = uVar1 + 1) {
    dVar3 = anon_unknown.dwarf_2ff416::SampleUniform();
    (this->_m_housePositionX).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] = dVar3;
    dVar3 = anon_unknown.dwarf_2ff416::SampleUniform();
    (this->_m_housePositionY).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] = dVar3;
  }
  return;
}

Assistant:

void Problem_CGBG_FF::ScatterHouses()
{
    for(Index hI=0; hI < _m_nrHouses; hI++)
    {
        //we sample a position for this house
        _m_housePositionX[hI] = SampleUniform();
        _m_housePositionY[hI] = SampleUniform();
    }
}